

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)

{
  SQInteger this;
  bool bVar1;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  local_28 = (SQObjectPtr *)0x0;
  o = (SQObjectPtr *)idx;
  idx_local = (SQInteger)v;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_28);
  this = idx_local;
  if (bVar1) {
    if (((local_28->super_SQObject)._unVal.pTable)->_firstfree == (_HashNode *)0x0) {
      SQVM::PushNull((SQVM *)idx_local);
    }
    else {
      SQObjectPtr::SQObjectPtr(&local_38,((local_28->super_SQObject)._unVal.pClass)->_base);
      SQVM::Push((SQVM *)this,&local_38);
      SQObjectPtr::~SQObjectPtr(&local_38);
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    if(_class(*o)->_base)
        v->Push(SQObjectPtr(_class(*o)->_base));
    else
        v->PushNull();
    return SQ_OK;
}